

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void AddFilesFromDirectoryToTpaList(char *directory,string *tpaList)

{
  uchar uVar1;
  int iVar2;
  DIR *__dirp;
  size_t sVar3;
  dirent *pdVar4;
  iterator iVar5;
  long lVar6;
  uint uVar7;
  string filenameWithoutExt;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  addedAssemblies;
  string filename;
  key_type local_110;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f0;
  stat local_c0;
  
  __dirp = opendir(directory);
  if (__dirp != (DIR *)0x0) {
    local_f0._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_f0._M_impl.super__Rb_tree_header._M_header;
    local_f0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_f0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_f0._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_f0._M_impl.super__Rb_tree_header._M_header._M_right =
         local_f0._M_impl.super__Rb_tree_header._M_header._M_left;
    for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
      sVar3 = strlen((char *)(&DAT_00106d70)[lVar6]);
LAB_001034a1:
      pdVar4 = readdir(__dirp);
      if (pdVar4 != (dirent *)0x0) {
        uVar1 = pdVar4->d_type;
        if (uVar1 == '\0') goto LAB_001034cb;
        if (uVar1 != '\b') goto code_r0x001034c6;
        goto LAB_00103547;
      }
      rewinddir(__dirp);
    }
    closedir(__dirp);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_f0);
  }
  return;
code_r0x001034c6:
  if (uVar1 == '\n') {
LAB_001034cb:
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    local_110._M_string_length = 0;
    local_110.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::append((char *)&local_110);
    std::__cxx11::string::append((char *)&local_110);
    std::__cxx11::string::append((char *)&local_110);
    iVar2 = stat(local_110._M_dataplus._M_p,&local_c0);
    uVar7 = local_c0.st_mode & 0xf000;
    std::__cxx11::string::~string((string *)&local_110);
    if ((iVar2 != -1) && (uVar7 == 0x8000)) {
LAB_00103547:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,pdVar4->d_name,(allocator<char> *)&local_110);
      uVar7 = (int)local_c0.st_ino - (int)sVar3;
      if (0 < (int)uVar7) {
        iVar2 = std::__cxx11::string::compare
                          ((ulong)&local_c0,(ulong)(uVar7 & 0x7fffffff),(char *)(long)(int)sVar3);
        if (iVar2 == 0) {
          std::__cxx11::string::substr((ulong)&local_110,(ulong)&local_c0);
          iVar5 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find(&local_f0,&local_110);
          if ((_Rb_tree_header *)iVar5._M_node == &local_f0._M_impl.super__Rb_tree_header) {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&local_f0,&local_110);
            std::__cxx11::string::append((char *)tpaList);
            std::__cxx11::string::append((char *)tpaList);
            std::__cxx11::string::append((string *)tpaList);
            std::__cxx11::string::append((char *)tpaList);
          }
          std::__cxx11::string::~string((string *)&local_110);
        }
      }
      std::__cxx11::string::~string((string *)&local_c0);
    }
  }
  goto LAB_001034a1;
}

Assistant:

void AddFilesFromDirectoryToTpaList(const char *directory,
                                    std::string &tpaList) {
  const char *const tpaExtensions[] = {
      ".ni.dll", // Probe for .ni.dll first so that it's preferred if ni and il
                 // coexist in the same dir
      ".dll",
      ".ni.exe",
      ".exe",
  };

  DIR *dir = opendir(directory);
  if (dir == nullptr) {
    return;
  }

  std::set<std::string> addedAssemblies;

  // Walk the directory for each extension separately so that we first get files
  // with .ni.dll extension, then files with .dll extension, etc.
  for (int extIndex = 0;
       extIndex < sizeof(tpaExtensions) / sizeof(tpaExtensions[0]);
       extIndex++) {
    const char *ext = tpaExtensions[extIndex];
    int extLength = strlen(ext);

    struct dirent *entry;

    // For all entries in the directory
    while ((entry = readdir(dir)) != nullptr) {
      // We are interested in files only
      switch (entry->d_type) {
      case DT_REG:
        break;

      // Handle symlinks and file systems that do not support d_type
      case DT_LNK:
      case DT_UNKNOWN: {
        std::string fullFilename;

        fullFilename.append(directory);
        fullFilename.append("/");
        fullFilename.append(entry->d_name);

        struct stat sb;
        if (stat(fullFilename.c_str(), &sb) == -1) {
          continue;
        }

        if (!S_ISREG(sb.st_mode)) {
          continue;
        }
      } break;

      default:
        continue;
      }

      std::string filename(entry->d_name);

      // Check if the extension matches the one we are looking for
      int extPos = filename.length() - extLength;
      if ((extPos <= 0) || (filename.compare(extPos, extLength, ext) != 0)) {
        continue;
      }

      std::string filenameWithoutExt(filename.substr(0, extPos));

      // Make sure if we have an assembly with multiple extensions present,
      // we insert only one version of it.
      if (addedAssemblies.find(filenameWithoutExt) == addedAssemblies.end()) {
        addedAssemblies.insert(filenameWithoutExt);

        tpaList.append(directory);
        tpaList.append("/");
        tpaList.append(filename);
        tpaList.append(":");
      }
    }

    // Rewind the directory stream to be able to iterate over it for the next
    // extension
    rewinddir(dir);
  }

  closedir(dir);
}